

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

uint __thiscall GoState<3U,_3U>::compute_hash_value(GoState<3U,_3U> *this)

{
  int j;
  int i;
  uint value;
  GoState<3U,_3U> *this_local;
  
  value = 0;
  for (i = 0; (uint)i < 3; i = i + 1) {
    for (j = 0; (uint)j < 3; j = j + 1) {
      value = value * 0x10001 + (uint)this->board[i][j];
    }
  }
  return value;
}

Assistant:

virtual unsigned int compute_hash_value() const
	{
		unsigned int value = 0;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			value = 65537 * value + board[i][j];
		}}
		return value;
	}